

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall
leveldb::VersionSet::Builder::MaybeAddFile(Builder *this,Version *v,int level,FileMetaData *f)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  InternalKey *a;
  int *in_RCX;
  int in_EDX;
  long in_RSI;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *in_RDI;
  long in_FS_OFFSET;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files;
  value_type *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar4 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::count
                    (in_RDI,(key_type *)in_stack_ffffffffffffffc0);
  if (sVar4 == 0) {
    a = (InternalKey *)(in_RSI + 0x20 + (long)in_EDX * 0x18);
    if ((0 < in_EDX) &&
       (bVar2 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                empty((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                      in_RDI), !bVar2)) {
      in_stack_ffffffffffffffc0 = (value_type *)(*(long *)&(in_RDI->_M_t)._M_impl + 0x38);
      std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)a);
      std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::operator[]
                ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)in_RDI
                 ,(size_type)in_stack_ffffffffffffffc0);
      iVar3 = InternalKeyComparator::Compare
                        ((InternalKeyComparator *)CONCAT44(in_EDX,in_stack_ffffffffffffffd8),a,
                         (InternalKey *)in_RDI);
      if (-1 < iVar3) {
        __assert_fail("vset_->icmp_.Compare((*files)[files->size() - 1]->largest, f->smallest) < 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                      ,0x2d6,
                      "void leveldb::VersionSet::Builder::MaybeAddFile(Version *, int, FileMetaData *)"
                     );
      }
    }
    *in_RCX = *in_RCX + 1;
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)in_RDI,
               in_stack_ffffffffffffffc0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void MaybeAddFile(Version* v, int level, FileMetaData* f) {
    if (levels_[level].deleted_files.count(f->number) > 0) {
      // File is deleted: do nothing
    } else {
      std::vector<FileMetaData*>* files = &v->files_[level];
      if (level > 0 && !files->empty()) {
        // Must not overlap
        assert(vset_->icmp_.Compare((*files)[files->size() - 1]->largest,
                                    f->smallest) < 0);
      }
      f->refs++;
      files->push_back(f);
    }
  }